

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O3

int av1_set_active_map(AV1_COMP *cpi,uchar *new_map_16x16,int rows,int cols)

{
  uchar uVar1;
  int iVar2;
  uchar *puVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uchar uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  ulong local_88;
  
  iVar4 = -1;
  if (((cpi->common).mi_params.mb_rows == rows) && ((cpi->common).mi_params.mb_cols == cols)) {
    puVar3 = (cpi->active_map).map;
    uVar16 = (cpi->common).mi_params.mi_rows;
    uVar14 = (ulong)uVar16;
    iVar2 = (cpi->common).mi_params.mi_cols;
    iVar4 = 0;
    (cpi->active_map).update = 0;
    (cpi->rc).percent_blocks_inactive = 0;
    if (new_map_16x16 != (uchar *)0x0) {
      if (0 < (int)uVar16) {
        iVar8 = 0;
        local_88 = 0;
        iVar10 = 0;
        iVar4 = 0;
        do {
          uVar12 = 4;
          if ((int)uVar16 < 4) {
            uVar12 = uVar16;
          }
          if ((int)uVar12 < 2) {
            uVar12 = 1;
          }
          if (0 < iVar2) {
            uVar11 = 0;
            iVar9 = iVar8;
            do {
              uVar1 = new_map_16x16[(uVar11 >> 2) + (local_88 >> 2) * (long)cols];
              uVar7 = '\0';
              if (uVar1 == '\0') {
                uVar7 = '\a';
              }
              if (local_88 < uVar14) {
                lVar15 = (long)iVar2 - uVar11;
                iVar13 = (int)lVar15;
                iVar5 = 4;
                if (iVar13 < 4) {
                  iVar5 = iVar13;
                }
                uVar6 = 0;
                iVar13 = iVar9;
                do {
                  if (0 < lVar15) {
                    lVar17 = 0;
                    do {
                      puVar3[iVar13 + (int)lVar17] = uVar7;
                      lVar17 = lVar17 + 1;
                    } while (lVar17 < iVar5);
                  }
                  uVar6 = uVar6 + 1;
                  iVar13 = iVar13 + iVar2;
                } while (uVar6 != uVar12);
              }
              iVar4 = iVar4 + (uint)(uVar1 == '\0');
              uVar11 = uVar11 + 4;
              iVar9 = iVar9 + 4;
            } while ((long)uVar11 < (long)iVar2);
            iVar10 = iVar10 + (iVar2 - 1U >> 2) + 1;
          }
          local_88 = local_88 + 4;
          uVar16 = uVar16 - 4;
          iVar8 = iVar8 + iVar2 * 4;
        } while (local_88 < uVar14);
        puVar3 = (uchar *)((long)(iVar4 * 100) / (long)iVar10 & 0xffffffff);
      }
      iVar4 = 0;
      (cpi->active_map).enabled = 1;
      (cpi->active_map).update = 1;
      (cpi->rc).percent_blocks_inactive = (int)puVar3;
    }
  }
  return iVar4;
}

Assistant:

int av1_set_active_map(AV1_COMP *cpi, unsigned char *new_map_16x16, int rows,
                       int cols) {
  const CommonModeInfoParams *const mi_params = &cpi->common.mi_params;
  if (rows == mi_params->mb_rows && cols == mi_params->mb_cols) {
    unsigned char *const active_map_4x4 = cpi->active_map.map;
    const int mi_rows = mi_params->mi_rows;
    const int mi_cols = mi_params->mi_cols;
    cpi->active_map.update = 0;
    cpi->rc.percent_blocks_inactive = 0;
    assert(mi_rows % 2 == 0 && mi_rows > 0);
    assert(mi_cols % 2 == 0 && mi_cols > 0);
    if (new_map_16x16) {
      int num_samples = 0;
      int num_blocks_inactive = 0;
      for (int r = 0; r < mi_rows; r += 4) {
        for (int c = 0; c < mi_cols; c += 4) {
          const uint8_t val = new_map_16x16[(r >> 2) * cols + (c >> 2)]
                                  ? AM_SEGMENT_ID_ACTIVE
                                  : AM_SEGMENT_ID_INACTIVE;
          num_samples++;
          if (val == AM_SEGMENT_ID_INACTIVE) num_blocks_inactive++;
          const int row_max = AOMMIN(4, mi_rows - r);
          const int col_max = AOMMIN(4, mi_cols - c);
          for (int x = 0; x < row_max; ++x) {
            for (int y = 0; y < col_max; ++y) {
              active_map_4x4[(r + x) * mi_cols + (c + y)] = val;
            }
          }
        }
      }
      cpi->active_map.enabled = 1;
      cpi->active_map.update = 1;
      assert(num_samples);
      cpi->rc.percent_blocks_inactive =
          (num_blocks_inactive * 100) / num_samples;
    }
    return 0;
  }

  return -1;
}